

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::RepeatedMessageFieldGenerator::
DetermineObjectiveCClassDefinitions
          (RepeatedMessageFieldGenerator *this,
          btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls)

{
  char *pcVar1;
  string_view key;
  string_view class_name;
  string local_68;
  string local_48;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
  local_28;
  
  key._M_str = "msg_type";
  key._M_len = 8;
  pcVar1 = "msg_type";
  SubstitutionMap::Value_abi_cxx11_
            (&local_48,
             &(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
              super_SingleFieldGenerator.super_FieldGenerator.variables_,key);
  class_name._M_str = pcVar1;
  class_name._M_len = (size_t)local_48._M_dataplus._M_p;
  ObjCClassDeclaration_abi_cxx11_(&local_68,(objectivec *)local_48._M_string_length,class_name);
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
  ::insert_unique<std::__cxx11::string,std::__cxx11::string>
            (&local_28,
             (btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
              *)fwd_decls,&local_68,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::DetermineObjectiveCClassDefinitions(
    absl::btree_set<std::string>* fwd_decls) const {
  fwd_decls->insert(ObjCClassDeclaration(variable("msg_type")));
}